

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_compress1X_usingCTable_internal_default
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  byte *pbVar10;
  long lVar11;
  long lVar12;
  ulong *puVar13;
  ulong uVar14;
  HUF_CStream_t bitC;
  HUF_CStream_t local_58;
  
  if (dstSize < 8) {
    return 0;
  }
  local_58.bitPos[0] = 0;
  local_58.bitPos[1] = 0;
  local_58.bitContainer[0] = 0;
  local_58.bitContainer[1] = 0;
  local_58.endPtr = (BYTE *)((long)dst + (dstSize - 8));
  if (dstSize == 8) {
    return 0;
  }
  uVar6 = (uint)*CTable;
  uVar7 = (uint)srcSize;
  local_58.ptr = (BYTE *)dst;
  local_58.startPtr = (BYTE *)dst;
  if (0xb < uVar6 || dstSize < ((*CTable & 0xffffffff) * srcSize >> 3) + 8) {
    uVar6 = uVar7 + 3;
    if (-1 < (int)uVar7) {
      uVar6 = uVar7;
    }
    iVar8 = uVar7 - (uVar6 & 0xfffffffc);
    if (0 < iVar8) {
      pbVar10 = (byte *)((long)(int)uVar7 + (long)src);
      iVar8 = iVar8 + 1;
      do {
        pbVar10 = pbVar10 + -1;
        uVar9 = CTable[(ulong)*pbVar10 + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        local_58.bitContainer[0] =
             uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f);
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        srcSize = (size_t)((int)srcSize - 1);
        iVar8 = iVar8 + -1;
      } while (1 < iVar8);
      uVar9 = local_58.bitPos[0] & 0xff;
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) goto LAB_001ad00e;
      if (0x40 < (uint)uVar9) goto LAB_001ad125;
      local_58.ptr = (BYTE *)dst;
      if (local_58.endPtr < dst) goto LAB_001ad02d;
      *(size_t *)dst = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)dst);
      if (local_58.endPtr < local_58.ptr) {
        local_58.ptr = local_58.endPtr;
      }
    }
    if ((srcSize & 3) != 0) goto LAB_001ad0a9;
    if ((srcSize & 4) != 0) {
      lVar2 = (long)(int)srcSize;
      lVar11 = 3;
      do {
        uVar9 = CTable[(ulong)*(byte *)((long)src + lVar11 + lVar2 + -4) + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -4) + 1];
      if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
      local_58.bitContainer[0] =
           uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f);
      local_58.bitPos[0] = uVar9 + local_58.bitPos[0];
      uVar9 = local_58.bitPos[0] & 0xff;
      if (0x40 < uVar9) goto LAB_001acfd0;
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) goto LAB_001ad00e;
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
      srcSize = lVar2 - 4;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) {
        local_58.ptr = local_58.endPtr;
      }
    }
    if ((srcSize & 7) == 0) {
      if (0 < (int)srcSize) {
        uVar9 = srcSize & 0xffffffff;
        lVar2 = (long)src + (uVar9 - 1);
        lVar11 = (long)src + (uVar9 - 5);
        do {
          lVar12 = 3;
          do {
            uVar4 = CTable[(ulong)*(byte *)(lVar2 + -3 + lVar12) + 1];
            if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
            local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f) | uVar4;
            local_58.bitPos[0] = local_58.bitPos[0] + uVar4;
            if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
          uVar4 = CTable[(ulong)*(byte *)((uVar9 - 4) + (long)src) + 1];
          if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[0] =
               uVar4 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f);
          local_58.bitPos[0] = uVar4 + local_58.bitPos[0];
          uVar4 = local_58.bitPos[0] & 0xff;
          if (0x40 < uVar4) goto LAB_001acfd0;
          cVar5 = (char)local_58.bitPos[0];
          local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
          if (uVar4 == 0) goto LAB_001ad00e;
          if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
          puVar13 = (ulong *)((uVar4 >> 3) + (long)local_58.ptr);
          if (local_58.endPtr < puVar13) {
            puVar13 = (ulong *)local_58.endPtr;
          }
          *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
          local_58.bitContainer[1] = 0;
          local_58.bitPos[1] = 0;
          lVar12 = 3;
          do {
            uVar4 = CTable[(ulong)*(byte *)(lVar11 + -3 + lVar12) + 1];
            local_58.ptr = (BYTE *)puVar13;
            if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
            local_58.bitContainer[1] = local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f) | uVar4;
            local_58.bitPos[1] = local_58.bitPos[1] + uVar4;
            if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
          uVar4 = CTable[(ulong)*(byte *)((long)src + (uVar9 - 8)) + 1];
          if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[1] =
               uVar4 & 0xffffffffffffff00 | local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f);
          local_58.bitPos[1] = uVar4 + local_58.bitPos[1];
          if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
          if (0x3f < (local_58.bitPos[1] & 0xff)) goto LAB_001ad08a;
          local_58.bitContainer[0] =
               local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
               local_58.bitContainer[1];
          uVar14 = local_58.bitPos[1] + local_58.bitPos[0];
          uVar4 = uVar14 & 0xff;
          local_58.bitPos[0] = uVar14;
          if (0x40 < uVar4) goto LAB_001ad06b;
          local_58.bitPos[0] = (size_t)((uint)uVar14 & 7);
          if (uVar4 == 0) goto LAB_001ad00e;
          if (local_58.endPtr < puVar13) goto LAB_001ad02d;
          local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)puVar13);
          if (local_58.endPtr < local_58.ptr) {
            local_58.ptr = local_58.endPtr;
          }
          *puVar13 = local_58.bitContainer[0] >> (-(char)uVar14 & 0x3fU);
          srcSize = uVar9 - 8;
          lVar2 = lVar2 + -8;
          lVar11 = lVar11 + -8;
          bVar1 = 8 < (long)uVar9;
          uVar9 = srcSize;
        } while (bVar1);
      }
      goto LAB_001ab7b3;
    }
LAB_001ad0c8:
    __assert_fail("n % (2 * kUnroll) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3eb4,
                  "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                 );
  }
  switch(uVar6) {
  case 7:
    uVar6 = uVar7 + 7;
    if (-1 < (int)uVar7) {
      uVar6 = uVar7;
    }
    iVar8 = uVar7 - (uVar6 & 0xfffffff8);
    if (0 < iVar8) {
      pbVar10 = (byte *)((long)(int)uVar7 + (long)src);
      iVar8 = iVar8 + 1;
      do {
        pbVar10 = pbVar10 + -1;
        uVar9 = CTable[(ulong)*pbVar10 + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        local_58.bitContainer[0] =
             uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f);
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        srcSize = (size_t)((int)srcSize - 1);
        iVar8 = iVar8 + -1;
      } while (1 < iVar8);
      uVar9 = local_58.bitPos[0] & 0xff;
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) goto LAB_001ad00e;
      if (0x40 < (uint)uVar9) {
LAB_001ad125:
        __assert_fail("nbBits <= sizeof(bitC->bitContainer[0]) * 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e6e,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      if (local_58.endPtr < dst) goto LAB_001ad02d;
      *(size_t *)dst = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)dst);
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
    }
    if ((srcSize & 7) != 0) goto LAB_001ad0a9;
    if ((srcSize & 8) != 0) {
      lVar2 = (long)(int)srcSize;
      lVar11 = 7;
      do {
        uVar9 = CTable[(ulong)*(byte *)((long)src + lVar11 + lVar2 + -8) + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -8) + 1];
      if (0xc < (uVar9 & 0xff)) {
LAB_001acfef:
        __assert_fail("HUF_getNbBits(elt) <= HUF_TABLELOG_ABSOLUTEMAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e2b,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
      }
      local_58.bitContainer[0] =
           uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f);
      local_58.bitPos[0] = uVar9 + local_58.bitPos[0];
      uVar9 = local_58.bitPos[0] & 0xff;
      if (0x40 < uVar9) {
LAB_001acfd0:
        __assert_fail("(bitC->bitPos[idx] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e37,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
      }
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) {
LAB_001ad00e:
        __assert_fail("nbBits > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e6d,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      if (local_58.endPtr < local_58.ptr) {
LAB_001ad02d:
        __assert_fail("bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e6f,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) {
LAB_001ad04c:
        __assert_fail("!kFast || bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e72,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      srcSize = lVar2 - 8;
    }
    if ((srcSize & 0xf) != 0) goto LAB_001ad0c8;
    if (0 < (int)srcSize) {
      uVar9 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar9 - 1);
      lVar11 = (long)src + (uVar9 - 9);
      do {
        lVar12 = 7;
        do {
          uVar4 = CTable[(ulong)*(byte *)(lVar2 + -7 + lVar12) + 1];
          if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f) | uVar4;
          local_58.bitPos[0] = local_58.bitPos[0] + uVar4;
          if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar4 = CTable[(ulong)*(byte *)((uVar9 - 8) + (long)src) + 1];
        if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[0] =
             uVar4 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f);
        local_58.bitPos[0] = uVar4 + local_58.bitPos[0];
        uVar4 = local_58.bitPos[0] & 0xff;
        if (0x40 < uVar4) goto LAB_001acfd0;
        cVar5 = (char)local_58.bitPos[0];
        local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
        if (uVar4 == 0) goto LAB_001ad00e;
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
        local_58.bitContainer[1] = 0;
        local_58.bitPos[1] = 0;
        lVar12 = 7;
        do {
          uVar4 = CTable[(ulong)*(byte *)(lVar11 + -7 + lVar12) + 1];
          if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[1] = local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f) | uVar4;
          local_58.bitPos[1] = local_58.bitPos[1] + uVar4;
          if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar4 = CTable[(ulong)*(byte *)((long)src + (uVar9 - 0x10)) + 1];
        if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[1] =
             uVar4 & 0xffffffffffffff00 | local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f);
        local_58.bitPos[1] = uVar4 + local_58.bitPos[1];
        if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
        if (0x3f < (local_58.bitPos[1] & 0xff)) {
LAB_001ad08a:
          __assert_fail("(bitC->bitPos[1] & 0xFF) < HUF_BITS_IN_CONTAINER",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3e56,"void HUF_mergeIndex1(HUF_CStream_t *)");
        }
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
             local_58.bitContainer[1];
        uVar14 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar4 = uVar14 & 0xff;
        local_58.bitPos[0] = uVar14;
        if (0x40 < uVar4) {
LAB_001ad06b:
          __assert_fail("(bitC->bitPos[0] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3e5a,"void HUF_mergeIndex1(HUF_CStream_t *)");
        }
        local_58.bitPos[0] = (size_t)((uint)uVar14 & 7);
        if (uVar4 == 0) goto LAB_001ad00e;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar14 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
        srcSize = uVar9 - 0x10;
        lVar2 = lVar2 + -0x10;
        lVar11 = lVar11 + -0x10;
        bVar1 = 0x10 < (long)uVar9;
        uVar9 = srcSize;
      } while (bVar1);
    }
    break;
  case 8:
    if (0 < (int)uVar7 % 7) {
      pbVar10 = (byte *)((long)(int)uVar7 + (long)src);
      iVar8 = (int)uVar7 % 7 + 1;
      do {
        pbVar10 = pbVar10 + -1;
        uVar9 = CTable[(ulong)*pbVar10 + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        local_58.bitContainer[0] =
             uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f);
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        srcSize = (size_t)((int)srcSize - 1);
        iVar8 = iVar8 + -1;
      } while (1 < iVar8);
      uVar9 = local_58.bitPos[0] & 0xff;
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) goto LAB_001ad00e;
      if (0x40 < (uint)uVar9) goto LAB_001ad125;
      if (local_58.endPtr < dst) goto LAB_001ad02d;
      *(size_t *)dst = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)dst);
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
    }
    uVar7 = (int)srcSize * -0x49249249 + 0x12492492;
    if (uVar7 < 0x24924925) {
      if (0x12492492 < (uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f)) {
        lVar2 = (long)(int)srcSize;
        lVar11 = 6;
        do {
          uVar9 = CTable[(ulong)*(byte *)((long)src + lVar11 + lVar2 + -7) + 1];
          if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
          local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
          if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
        uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -7) + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[0] =
             uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f);
        local_58.bitPos[0] = uVar9 + local_58.bitPos[0];
        uVar9 = local_58.bitPos[0] & 0xff;
        if (0x40 < uVar9) goto LAB_001acfd0;
        cVar5 = (char)local_58.bitPos[0];
        local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
        if (uVar9 == 0) goto LAB_001ad00e;
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
        srcSize = lVar2 - 7;
      }
      uVar7 = (int)srcSize * -0x49249249 + 0x12492492;
      if ((uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f) < 0x12492493) {
        if (0 < (int)srcSize) {
          uVar9 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar9 - 1);
          lVar11 = (long)src + (uVar9 - 8);
          do {
            lVar12 = 6;
            do {
              uVar4 = CTable[(ulong)*(byte *)(lVar2 + -6 + lVar12) + 1];
              if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
              local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f) | uVar4;
              local_58.bitPos[0] = local_58.bitPos[0] + uVar4;
              if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
            uVar4 = CTable[(ulong)*(byte *)((uVar9 - 7) + (long)src) + 1];
            if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
            local_58.bitContainer[0] =
                 uVar4 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f);
            local_58.bitPos[0] = uVar4 + local_58.bitPos[0];
            uVar4 = local_58.bitPos[0] & 0xff;
            if (0x40 < uVar4) goto LAB_001acfd0;
            cVar5 = (char)local_58.bitPos[0];
            local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
            if (uVar4 == 0) goto LAB_001ad00e;
            if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
            *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
            local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)local_58.ptr);
            if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
            local_58.bitContainer[1] = 0;
            local_58.bitPos[1] = 0;
            lVar12 = 6;
            do {
              uVar4 = CTable[(ulong)*(byte *)(lVar11 + -6 + lVar12) + 1];
              if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
              local_58.bitContainer[1] = local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f) | uVar4;
              local_58.bitPos[1] = local_58.bitPos[1] + uVar4;
              if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
            uVar4 = CTable[(ulong)*(byte *)((long)src + (uVar9 - 0xe)) + 1];
            if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
            local_58.bitContainer[1] =
                 uVar4 & 0xffffffffffffff00 | local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f);
            local_58.bitPos[1] = uVar4 + local_58.bitPos[1];
            if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
            if (0x3f < (local_58.bitPos[1] & 0xff)) goto LAB_001ad08a;
            local_58.bitContainer[0] =
                 local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
                 local_58.bitContainer[1];
            uVar14 = local_58.bitPos[1] + local_58.bitPos[0];
            uVar4 = uVar14 & 0xff;
            local_58.bitPos[0] = uVar14;
            if (0x40 < uVar4) goto LAB_001ad06b;
            local_58.bitPos[0] = (size_t)((uint)uVar14 & 7);
            if (uVar4 == 0) goto LAB_001ad00e;
            *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar14 & 0x3fU);
            local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)local_58.ptr);
            if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
            srcSize = uVar9 - 0xe;
            lVar2 = lVar2 + -0xe;
            lVar11 = lVar11 + -0xe;
            bVar1 = 0xe < (long)uVar9;
            uVar9 = srcSize;
          } while (bVar1);
        }
        break;
      }
      goto LAB_001ad0c8;
    }
LAB_001ad0a9:
    __assert_fail("n % kUnroll == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3ea8,
                  "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                 );
  case 9:
    if (0 < (int)uVar7 % 6) {
      pbVar10 = (byte *)((long)(int)uVar7 + (long)src);
      iVar8 = (int)uVar7 % 6 + 1;
      do {
        pbVar10 = pbVar10 + -1;
        uVar9 = CTable[(ulong)*pbVar10 + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        local_58.bitContainer[0] =
             uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f);
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        srcSize = (size_t)((int)srcSize - 1);
        iVar8 = iVar8 + -1;
      } while (1 < iVar8);
      uVar9 = local_58.bitPos[0] & 0xff;
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) goto LAB_001ad00e;
      if (0x40 < (uint)uVar9) goto LAB_001ad125;
      if (local_58.endPtr < dst) goto LAB_001ad02d;
      *(size_t *)dst = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)dst);
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
    }
    iVar8 = (int)srcSize;
    uVar7 = iVar8 * -0x55555555 + 0x2aaaaaaa;
    if (0x2aaaaaaa < (uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f)) goto LAB_001ad0a9;
    if (0x15555554 < (iVar8 * -0x55555555 + 0x2aaaaaa8U >> 2 | iVar8 * -0x40000000)) {
      lVar2 = (long)iVar8;
      lVar11 = 5;
      do {
        uVar9 = CTable[(ulong)*(byte *)((long)src + lVar11 + lVar2 + -6) + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -6) + 1];
      if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
      local_58.bitContainer[0] =
           uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f);
      local_58.bitPos[0] = uVar9 + local_58.bitPos[0];
      uVar9 = local_58.bitPos[0] & 0xff;
      if (0x40 < uVar9) goto LAB_001acfd0;
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) goto LAB_001ad00e;
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
      srcSize = lVar2 - 6;
    }
    iVar8 = (int)srcSize;
    if (0x15555554 < (iVar8 * -0x55555555 + 0x2aaaaaa8U >> 2 | iVar8 * -0x40000000))
    goto LAB_001ad0c8;
    if (0 < iVar8) {
      uVar9 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar9 - 1);
      lVar11 = (long)src + (uVar9 - 7);
      do {
        lVar12 = 5;
        do {
          uVar4 = CTable[(ulong)*(byte *)(lVar2 + -5 + lVar12) + 1];
          if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f) | uVar4;
          local_58.bitPos[0] = local_58.bitPos[0] + uVar4;
          if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar4 = CTable[(ulong)*(byte *)((uVar9 - 6) + (long)src) + 1];
        if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[0] =
             uVar4 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f);
        local_58.bitPos[0] = uVar4 + local_58.bitPos[0];
        uVar4 = local_58.bitPos[0] & 0xff;
        if (0x40 < uVar4) goto LAB_001acfd0;
        cVar5 = (char)local_58.bitPos[0];
        local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
        if (uVar4 == 0) goto LAB_001ad00e;
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
        local_58.bitContainer[1] = 0;
        local_58.bitPos[1] = 0;
        lVar12 = 5;
        do {
          uVar4 = CTable[(ulong)*(byte *)(lVar11 + -5 + lVar12) + 1];
          if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[1] = local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f) | uVar4;
          local_58.bitPos[1] = local_58.bitPos[1] + uVar4;
          if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar4 = CTable[(ulong)*(byte *)((long)src + (uVar9 - 0xc)) + 1];
        if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[1] =
             uVar4 & 0xffffffffffffff00 | local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f);
        local_58.bitPos[1] = uVar4 + local_58.bitPos[1];
        if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
        if (0x3f < (local_58.bitPos[1] & 0xff)) goto LAB_001ad08a;
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
             local_58.bitContainer[1];
        uVar14 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar4 = uVar14 & 0xff;
        local_58.bitPos[0] = uVar14;
        if (0x40 < uVar4) goto LAB_001ad06b;
        local_58.bitPos[0] = (size_t)((uint)uVar14 & 7);
        if (uVar4 == 0) goto LAB_001ad00e;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar14 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
        srcSize = uVar9 - 0xc;
        lVar2 = lVar2 + -0xc;
        lVar11 = lVar11 + -0xc;
        bVar1 = 0xc < (long)uVar9;
        uVar9 = srcSize;
      } while (bVar1);
    }
    break;
  case 10:
    if (0 < (int)uVar7 % 5) {
      pbVar10 = (byte *)((long)(int)uVar7 + (long)src);
      iVar8 = (int)uVar7 % 5 + 1;
      do {
        pbVar10 = pbVar10 + -1;
        uVar9 = CTable[(ulong)*pbVar10 + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        local_58.bitContainer[0] =
             uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f);
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        srcSize = (size_t)((int)srcSize - 1);
        iVar8 = iVar8 + -1;
      } while (1 < iVar8);
      uVar9 = local_58.bitPos[0] & 0xff;
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) goto LAB_001ad00e;
      if (0x40 < (uint)uVar9) goto LAB_001ad125;
      if (local_58.endPtr < dst) goto LAB_001ad02d;
      *(size_t *)dst = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)dst);
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
    }
    iVar8 = (int)srcSize * -0x33333333;
    if (0x33333332 < iVar8 + 0x19999999U) goto LAB_001ad0a9;
    uVar7 = iVar8 + 0x19999998;
    if (0x19999998 < (uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f)) {
      lVar2 = (long)(int)srcSize;
      lVar11 = 4;
      do {
        uVar9 = CTable[(ulong)*(byte *)((long)src + lVar11 + lVar2 + -5) + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -5) + 1];
      if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
      local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
      local_58.bitPos[0] = uVar9 + local_58.bitPos[0];
      uVar9 = local_58.bitPos[0] & 0xff;
      if (0x40 < uVar9) goto LAB_001acfd0;
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) goto LAB_001ad00e;
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
      srcSize = lVar2 - 5;
    }
    uVar7 = (int)srcSize * -0x33333333 + 0x19999998;
    if (0x19999998 < (uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f)) goto LAB_001ad0c8;
    if (0 < (int)srcSize) {
      uVar9 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar9 - 1);
      lVar11 = (long)src + (uVar9 - 6);
      do {
        lVar12 = 4;
        do {
          uVar4 = CTable[(ulong)*(byte *)(lVar2 + -4 + lVar12) + 1];
          if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f) | uVar4;
          local_58.bitPos[0] = local_58.bitPos[0] + uVar4;
          if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar4 = CTable[(ulong)*(byte *)((uVar9 - 5) + (long)src) + 1];
        if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f) | uVar4;
        local_58.bitPos[0] = uVar4 + local_58.bitPos[0];
        uVar4 = local_58.bitPos[0] & 0xff;
        if (0x40 < uVar4) goto LAB_001acfd0;
        cVar5 = (char)local_58.bitPos[0];
        local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
        if (uVar4 == 0) goto LAB_001ad00e;
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
        local_58.bitContainer[1] = 0;
        local_58.bitPos[1] = 0;
        lVar12 = 4;
        do {
          uVar4 = CTable[(ulong)*(byte *)(lVar11 + -4 + lVar12) + 1];
          if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[1] = local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f) | uVar4;
          local_58.bitPos[1] = local_58.bitPos[1] + uVar4;
          if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar4 = CTable[(ulong)*(byte *)((long)src + (uVar9 - 10)) + 1];
        if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[1] = local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f) | uVar4;
        local_58.bitPos[1] = uVar4 + local_58.bitPos[1];
        if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
        if (0x3f < (local_58.bitPos[1] & 0xff)) goto LAB_001ad08a;
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
             local_58.bitContainer[1];
        uVar14 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar4 = uVar14 & 0xff;
        local_58.bitPos[0] = uVar14;
        if (0x40 < uVar4) goto LAB_001ad06b;
        local_58.bitPos[0] = (size_t)((uint)uVar14 & 7);
        if (uVar4 == 0) goto LAB_001ad00e;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar14 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
        srcSize = uVar9 - 10;
        lVar2 = lVar2 + -10;
        lVar11 = lVar11 + -10;
        bVar1 = 10 < (long)uVar9;
        uVar9 = srcSize;
      } while (bVar1);
    }
    break;
  case 0xb:
    if (0 < (int)uVar7 % 5) {
      pbVar10 = (byte *)((long)(int)uVar7 + (long)src);
      iVar8 = (int)uVar7 % 5 + 1;
      do {
        pbVar10 = pbVar10 + -1;
        uVar9 = CTable[(ulong)*pbVar10 + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        local_58.bitContainer[0] =
             uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f);
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        srcSize = (size_t)((int)srcSize - 1);
        iVar8 = iVar8 + -1;
      } while (1 < iVar8);
      uVar9 = local_58.bitPos[0] & 0xff;
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) goto LAB_001ad00e;
      if (0x40 < (uint)uVar9) goto LAB_001ad125;
      if (local_58.endPtr < dst) goto LAB_001ad02d;
      *(size_t *)dst = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)dst);
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
    }
    iVar8 = (int)srcSize * -0x33333333;
    if (0x33333332 < iVar8 + 0x19999999U) goto LAB_001ad0a9;
    uVar7 = iVar8 + 0x19999998;
    if (0x19999998 < (uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f)) {
      lVar2 = (long)(int)srcSize;
      lVar11 = 4;
      do {
        uVar9 = CTable[(ulong)*(byte *)((long)src + lVar11 + lVar2 + -5) + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -5) + 1];
      if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
      local_58.bitContainer[0] =
           uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f);
      local_58.bitPos[0] = uVar9 + local_58.bitPos[0];
      uVar9 = local_58.bitPos[0] & 0xff;
      if (0x40 < uVar9) goto LAB_001acfd0;
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) goto LAB_001ad00e;
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
      srcSize = lVar2 - 5;
    }
    uVar7 = (int)srcSize * -0x33333333 + 0x19999998;
    if (0x19999998 < (uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f)) goto LAB_001ad0c8;
    if (0 < (int)srcSize) {
      uVar9 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar9 - 1);
      lVar11 = (long)src + (uVar9 - 6);
      do {
        lVar12 = 4;
        do {
          uVar4 = CTable[(ulong)*(byte *)(lVar2 + -4 + lVar12) + 1];
          if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f) | uVar4;
          local_58.bitPos[0] = local_58.bitPos[0] + uVar4;
          if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar4 = CTable[(ulong)*(byte *)((uVar9 - 5) + (long)src) + 1];
        if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[0] =
             uVar4 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f);
        local_58.bitPos[0] = uVar4 + local_58.bitPos[0];
        uVar4 = local_58.bitPos[0] & 0xff;
        if (0x40 < uVar4) goto LAB_001acfd0;
        cVar5 = (char)local_58.bitPos[0];
        local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
        if (uVar4 == 0) goto LAB_001ad00e;
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
        local_58.bitContainer[1] = 0;
        local_58.bitPos[1] = 0;
        lVar12 = 4;
        do {
          uVar4 = CTable[(ulong)*(byte *)(lVar11 + -4 + lVar12) + 1];
          if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[1] = local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f) | uVar4;
          local_58.bitPos[1] = local_58.bitPos[1] + uVar4;
          if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar4 = CTable[(ulong)*(byte *)((long)src + (uVar9 - 10)) + 1];
        if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[1] =
             uVar4 & 0xffffffffffffff00 | local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f);
        local_58.bitPos[1] = uVar4 + local_58.bitPos[1];
        if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
        if (0x3f < (local_58.bitPos[1] & 0xff)) goto LAB_001ad08a;
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
             local_58.bitContainer[1];
        uVar14 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar4 = uVar14 & 0xff;
        local_58.bitPos[0] = uVar14;
        if (0x40 < uVar4) goto LAB_001ad06b;
        local_58.bitPos[0] = (size_t)((uint)uVar14 & 7);
        if (uVar4 == 0) goto LAB_001ad00e;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar14 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
        srcSize = uVar9 - 10;
        lVar2 = lVar2 + -10;
        lVar11 = lVar11 + -10;
        bVar1 = 10 < (long)uVar9;
        uVar9 = srcSize;
      } while (bVar1);
    }
    break;
  default:
    if (0 < (int)uVar7 % 9) {
      pbVar10 = (byte *)((long)(int)uVar7 + (long)src);
      iVar8 = (int)uVar7 % 9 + 1;
      do {
        pbVar10 = pbVar10 + -1;
        uVar9 = CTable[(ulong)*pbVar10 + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        local_58.bitContainer[0] =
             uVar9 & 0xffffffffffffff00 | local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f);
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        srcSize = (size_t)((int)srcSize - 1);
        iVar8 = iVar8 + -1;
      } while (1 < iVar8);
      uVar9 = local_58.bitPos[0] & 0xff;
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) goto LAB_001ad00e;
      if (0x40 < (uint)uVar9) goto LAB_001ad125;
      if (local_58.endPtr < dst) goto LAB_001ad02d;
      *(size_t *)dst = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)dst);
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
    }
    uVar7 = (int)srcSize * 0x38e38e39 + 0xe38e38e;
    if (0x1c71c71c < uVar7) goto LAB_001ad0a9;
    if (0xe38e38e < (uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f)) {
      lVar2 = (long)(int)srcSize;
      lVar11 = 8;
      do {
        uVar9 = CTable[(ulong)*(byte *)((long)src + lVar11 + lVar2 + -9) + 1];
        if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
        local_58.bitPos[0] = local_58.bitPos[0] + uVar9;
        if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      uVar9 = CTable[(ulong)*(byte *)((long)src + lVar2 + -9) + 1];
      if (0xc < (uVar9 & 0xff)) goto LAB_001acfef;
      local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar9 & 0x3f) | uVar9;
      local_58.bitPos[0] = uVar9 + local_58.bitPos[0];
      uVar9 = local_58.bitPos[0] & 0xff;
      if (0x40 < uVar9) goto LAB_001acfd0;
      cVar5 = (char)local_58.bitPos[0];
      local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
      if (uVar9 == 0) goto LAB_001ad00e;
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
      *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
      local_58.ptr = (BYTE *)((uVar9 >> 3) + (long)local_58.ptr);
      if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
      srcSize = lVar2 - 9;
    }
    uVar7 = (int)srcSize * 0x38e38e39 + 0xe38e38e;
    if (0xe38e38e < (uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f)) goto LAB_001ad0c8;
    if (0 < (int)srcSize) {
      uVar9 = srcSize & 0xffffffff;
      lVar2 = (long)src + (uVar9 - 1);
      lVar11 = (long)src + (uVar9 - 10);
      do {
        lVar12 = 8;
        do {
          uVar4 = CTable[(ulong)*(byte *)(lVar2 + -8 + lVar12) + 1];
          if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f) | uVar4;
          local_58.bitPos[0] = local_58.bitPos[0] + uVar4;
          if (0x40 < ((uint)local_58.bitPos[0] & 0xff)) goto LAB_001acfd0;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar4 = CTable[(ulong)*(byte *)((uVar9 - 9) + (long)src) + 1];
        if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[0] = local_58.bitContainer[0] >> ((byte)uVar4 & 0x3f) | uVar4;
        local_58.bitPos[0] = uVar4 + local_58.bitPos[0];
        uVar4 = local_58.bitPos[0] & 0xff;
        if (0x40 < uVar4) goto LAB_001acfd0;
        cVar5 = (char)local_58.bitPos[0];
        local_58.bitPos[0] = (size_t)((uint)local_58.bitPos[0] & 7);
        if (uVar4 == 0) goto LAB_001ad00e;
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad02d;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-cVar5 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
        local_58.bitContainer[1] = 0;
        local_58.bitPos[1] = 0;
        lVar12 = 8;
        do {
          uVar4 = CTable[(ulong)*(byte *)(lVar11 + -8 + lVar12) + 1];
          if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
          local_58.bitContainer[1] = local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f) | uVar4;
          local_58.bitPos[1] = local_58.bitPos[1] + uVar4;
          if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar4 = CTable[(ulong)*(byte *)((long)src + (uVar9 - 0x12)) + 1];
        if (0xc < (uVar4 & 0xff)) goto LAB_001acfef;
        local_58.bitContainer[1] = local_58.bitContainer[1] >> ((byte)uVar4 & 0x3f) | uVar4;
        local_58.bitPos[1] = uVar4 + local_58.bitPos[1];
        if (0x40 < ((uint)local_58.bitPos[1] & 0xff)) goto LAB_001acfd0;
        if (0x3f < (local_58.bitPos[1] & 0xff)) goto LAB_001ad08a;
        local_58.bitContainer[0] =
             local_58.bitContainer[0] >> ((byte)local_58.bitPos[1] & 0x3f) |
             local_58.bitContainer[1];
        uVar14 = local_58.bitPos[1] + local_58.bitPos[0];
        uVar4 = uVar14 & 0xff;
        local_58.bitPos[0] = uVar14;
        if (0x40 < uVar4) goto LAB_001ad06b;
        local_58.bitPos[0] = (size_t)((uint)uVar14 & 7);
        if (uVar4 == 0) goto LAB_001ad00e;
        *(size_t *)local_58.ptr = local_58.bitContainer[0] >> (-(char)uVar14 & 0x3fU);
        local_58.ptr = (BYTE *)((uVar4 >> 3) + (long)local_58.ptr);
        if (local_58.endPtr < local_58.ptr) goto LAB_001ad04c;
        srcSize = uVar9 - 0x12;
        lVar2 = lVar2 + -0x12;
        lVar11 = lVar11 + -0x12;
        bVar1 = 0x12 < (long)uVar9;
        uVar9 = srcSize;
      } while (bVar1);
    }
  }
LAB_001ab7b3:
  if ((int)srcSize != 0) {
    __assert_fail("n == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3ecb,
                  "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                 );
  }
  if (local_58.endPtr < local_58.ptr) {
    __assert_fail("bitC.ptr <= bitC.endPtr",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3f16,
                  "size_t HUF_compress1X_usingCTable_internal_body(void *, size_t, const void *, size_t, const HUF_CElt *)"
                 );
  }
  sVar3 = HUF_closeCStream(&local_58);
  return sVar3;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    U32 const tableLog = (U32)CTable[0];
    HUF_CElt const* ct = CTable + 1;
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    HUF_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = HUF_initCStream(&bitC, op, (size_t)(oend-op));
      if (HUF_isError(initErr)) return 0; }

    if (dstSize < HUF_tightCompressBound(srcSize, (size_t)tableLog) || tableLog > 11)
        HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ MEM_32bits() ? 2 : 4, /* kFast */ 0, /* kLastFast */ 0);
    else {
        if (MEM_32bits()) {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10: ZSTD_FALLTHROUGH;
            case 9: ZSTD_FALLTHROUGH;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 7: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 3, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        } else {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 9:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 6, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 7, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 7:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 8, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 6: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 9, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        }
    }
    assert(bitC.ptr <= bitC.endPtr);

    return HUF_closeCStream(&bitC);
}